

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pick.cpp
# Opt level: O2

pair<polyscope::Structure_*,_unsigned_long> polyscope::pick::evaluatePickQuery(int xPos,int yPos)

{
  long *plVar1;
  char cVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  uint64_t globalInd;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_XMM1_Da;
  pair<polyscope::Structure_*,_unsigned_long> pVar5;
  vec3 vec;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>
  x;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>
  cat;
  
  pVar5 = (pair<polyscope::Structure_*,_unsigned_long>)ZEXT816(0);
  if (-2 < xPos) {
    if ((yPos < -1) || (view::bufferWidth <= xPos)) {
      pVar5 = (pair<polyscope::Structure_*,_unsigned_long>)ZEXT816(0);
    }
    else {
      pVar5 = (pair<polyscope::Structure_*,_unsigned_long>)ZEXT816(0);
      if (yPos < view::bufferHeight) {
        plVar1 = (long *)render::engine[0x1e];
        (**(code **)(*render::engine + 0x50))(render::engine,0);
        (**(code **)(*render::engine + 0x58))(render::engine,7);
        (**(code **)(*plVar1 + 0x58))(plVar1,view::bufferWidth,view::bufferHeight);
        (**(code **)(*plVar1 + 0x50))(plVar1,0,0,view::bufferWidth,view::bufferHeight);
        plVar1[1] = 0;
        *(undefined4 *)(plVar1 + 2) = 0;
        cVar2 = (**(code **)(*plVar1 + 0x18))(plVar1);
        pVar5 = (pair<polyscope::Structure_*,_unsigned_long>)ZEXT816(0);
        if (cVar2 != '\0') {
          (**(code **)(*plVar1 + 0x20))(plVar1);
          for (p_Var4 = (_Rb_tree_node_base *)state::structures_abi_cxx11_._24_8_;
              p_Var4 != (_Rb_tree_node_base *)(state::structures_abi_cxx11_ + 8);
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>
            ::pair(&cat,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>
                         *)(p_Var4 + 1));
            for (p_Var3 = cat.second._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var3 != &cat.second._M_t._M_impl.super__Rb_tree_header;
                p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>
              ::pair(&x,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>
                         *)(p_Var3 + 1));
              (*(x.second)->_vptr_Structure[3])();
              std::__cxx11::string::~string((string *)&x);
            }
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::Structure_*>_>_>_>
            ::~pair(&cat);
          }
          pVar5 = (pair<polyscope::Structure_*,_unsigned_long>)ZEXT816(0);
          if (yPos != -1 && xPos != -1) {
            vec._0_8_ = (**(code **)(*plVar1 + 0x60))(plVar1,xPos,view::bufferHeight - yPos);
            vec.field_2 = in_XMM1_Da;
            globalInd = vecToInd(vec);
            pVar5 = globalIndexToLocal(globalInd);
          }
        }
      }
    }
  }
  return pVar5;
}

Assistant:

std::pair<Structure*, size_t> evaluatePickQuery(int xPos, int yPos) {

  // NOTE: hack used for debugging: if xPos == yPos == 1 we do a pick render but do not query the value.

  // Be sure not to pick outside of buffer
  if (xPos < -1 || xPos >= view::bufferWidth || yPos < -1 || yPos >= view::bufferHeight) {
    return {nullptr, 0};
  }

  render::FrameBuffer* pickFramebuffer = render::engine->pickFramebuffer.get();

  render::engine->setDepthMode();
  render::engine->setBlendMode(BlendMode::Disable);

  pickFramebuffer->resize(view::bufferWidth, view::bufferHeight);
  pickFramebuffer->setViewport(0, 0, view::bufferWidth, view::bufferHeight);
  pickFramebuffer->clearColor = glm::vec3{0., 0., 0.};
  if (!pickFramebuffer->bindForRendering()) return {nullptr, 0};
  pickFramebuffer->clear();

  // Render pick buffer
  for (auto cat : state::structures) {
    for (auto x : cat.second) {
      x.second->drawPick();
    }
  }

  if (xPos == -1 || yPos == -1) {
    return {nullptr, 0};
  }

  // Read from the pick buffer
  std::array<float, 4> result = pickFramebuffer->readFloat4(xPos, view::bufferHeight - yPos);
  size_t globalInd = pick::vecToInd(glm::vec3{result[0], result[1], result[2]});

  return pick::globalIndexToLocal(globalInd);
}